

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_declared_builtin_block
          (CompilerGLSL *this,StorageClass storage,ExecutionModel model)

{
  mapped_type mVar1;
  uint uVar2;
  size_t sVar3;
  Variant *pVVar4;
  Decoration *pDVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  SPIRVariable *pSVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  StorageClass SVar18;
  ExecutionModel EVar19;
  SPIRType *pSVar20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  SPIREntryPoint *pSVar23;
  runtime_error *prVar24;
  BuiltIn BVar25;
  string *psVar26;
  char *pcVar27;
  TypedID<(spirv_cross::Types)0> *pTVar28;
  ulong uVar29;
  CompilerGLSL *this_00;
  TypedID<(spirv_cross::Types)0> *pTVar30;
  char (*in_R9) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar31;
  long lVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  uint32_t geom_stream;
  uint32_t xfb_buffer;
  uint32_t xfb_stride;
  uint32_t clip_distance_size;
  uint32_t cull_distance_size;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  builtin_xfb_offsets;
  Bitset emitted_builtins;
  Bitset global_builtins;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attr;
  Bitset builtins;
  uint32_t local_1378;
  uint32_t local_1374;
  uint32_t local_1370;
  uint local_136c;
  SPIRVariable *local_1368;
  CompilerGLSL *local_1360;
  StorageClass local_1354;
  undefined4 local_1350;
  BuiltIn local_134c;
  SPIRType *local_1348;
  ExecutionModel local_133c;
  uint local_1338;
  uint local_1334;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1330;
  undefined1 local_1328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1318;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined4 local_12f8;
  undefined8 local_12f0;
  __node_base_ptr p_Stack_12e8;
  string local_12e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12c0;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_12b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1280;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_1278;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  local_1240;
  undefined1 local_1128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1118;
  long lStack_1108;
  char local_1100 [8];
  char local_10f8 [8];
  __node_base_ptr ap_Stack_10f0 [508];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  local_12c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_12b8._M_buckets = &local_12b8._M_single_bucket;
  local_12b8._M_bucket_count = 1;
  local_12b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_12b8._M_element_count = 0;
  local_12b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_12b8._M_rehash_policy._M_next_resize = 0;
  local_12b8._M_single_bucket = (__node_base_ptr)0x0;
  local_1280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  local_1278._M_buckets = &local_1278._M_single_bucket;
  local_1278._M_bucket_count = 1;
  local_1278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1278._M_element_count = 0;
  local_1278._M_rehash_policy._M_max_load_factor = 1.0;
  local_1278._M_rehash_policy._M_next_resize = 0;
  local_1278._M_single_bucket = (__node_base_ptr)0x0;
  local_12e0._M_dataplus._M_p = (pointer)&local_1334;
  local_1334 = 0;
  local_1328._0_8_ = &local_1338;
  local_1338 = 0;
  local_1370 = 0;
  local_1374 = 0;
  local_1378 = 0;
  local_1318._M_allocated_capacity = (size_type)&p_Stack_12e8;
  local_1318._8_8_ = 1;
  local_1308 = 0;
  uStack_1300 = 0;
  local_12f8 = 0x3f800000;
  local_12f0 = 0;
  p_Stack_12e8 = (__node_base_ptr)0x0;
  ParsedIR::create_loop_hard_lock(&(this->super_Compiler).ir);
  sVar3 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  local_1360 = this;
  local_133c = model;
  if (sVar3 == 0) {
    bVar10 = false;
    bVar15 = 0;
    local_136c = 0;
  }
  else {
    pTVar30 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar28 = pTVar30 + sVar3;
    local_1330 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_1350 = 0;
    bVar10 = false;
    bVar14 = false;
    local_136c = 0;
    local_1354 = storage;
    local_1328._8_8_ = pTVar28;
    do {
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[pTVar30->id].type == TypeVariable) {
        local_1368 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + pTVar30->id);
        pSVar20 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(local_1368->super_IVariant).field_0xc);
        bVar12 = Compiler::has_decoration
                           (&this->super_Compiler,(ID)(pSVar20->super_IVariant).self.id,Block);
        local_1128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1128._8_8_ = ap_Stack_10f0;
        local_1118._M_allocated_capacity = 1;
        local_1118._8_8_ = 0;
        lStack_1108 = 0;
        local_1100[0] = '\0';
        local_1100[1] = '\0';
        local_1100[2] = -0x80;
        local_1100[3] = '?';
        local_10f8[0] = '\0';
        local_10f8[1] = '\0';
        local_10f8[2] = '\0';
        local_10f8[3] = '\0';
        local_10f8[4] = '\0';
        local_10f8[5] = '\0';
        local_10f8[6] = '\0';
        local_10f8[7] = '\0';
        ap_Stack_10f0[0] = (__node_base_ptr)0x0;
        SVar18 = local_1368->storage;
        local_1348 = pSVar20;
        if (bVar12 && SVar18 == storage) {
          bVar13 = Compiler::is_builtin_variable(&this->super_Compiler,local_1368);
          if (!bVar13) {
            SVar18 = local_1368->storage;
            goto LAB_002c7d62;
          }
          pmVar21 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1330,&(local_1348->super_IVariant).self);
          sVar3 = (pmVar21->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size;
          if (sVar3 != 0) {
            pDVar5 = (pmVar21->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
            lVar32 = 0;
            uVar29 = 0;
            do {
              if (((*(char *)((long)(pDVar5->extended).values + lVar32 + -0x44) == '\x01') &&
                  (BVar25 = *(BuiltIn *)((long)(pDVar5->extended).values + lVar32 + -0x80),
                  BVar25 < BuiltInVertexId)) && (BVar25 != 2)) {
                local_1128._0_8_ = local_1128._0_8_ | 1L << ((byte)BVar25 & 0x3f);
                if (BVar25 == BuiltInClipDistance) {
                  pSVar20 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1348->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar29].id);
                  uVar16 = to_array_size_literal
                                     (this,pSVar20,
                                      (int)(pSVar20->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
                  psVar26 = (string *)local_1328;
LAB_002c7be4:
                  *(uint32_t *)(psVar26->_M_dataplus)._M_p = uVar16;
                  BVar25 = *(BuiltIn *)((long)(pDVar5->extended).values + lVar32 + -0x80);
                }
                else if (BVar25 == BuiltInCullDistance) {
                  pSVar20 = Variant::get<spirv_cross::SPIRType>
                                      ((this->super_Compiler).ir.ids.
                                       super_VectorView<spirv_cross::Variant>.ptr +
                                       (local_1348->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                       .ptr[uVar29].id);
                  uVar16 = to_array_size_literal
                                     (this,pSVar20,
                                      (int)(pSVar20->array).super_VectorView<unsigned_int>.
                                           buffer_size - 1);
                  psVar26 = &local_12e0;
                  goto LAB_002c7be4;
                }
                if (((BVar25 < BuiltInVertexId) && (BVar25 != 2)) &&
                   ((*(byte *)((long)&(pDVar5->decoration_flags).lower + lVar32 + 4) & 8) != 0)) {
                  mVar1 = *(mapped_type *)((long)(pDVar5->extended).values + lVar32 + -0x6c);
                  local_134c = BVar25;
                  pmVar22 = ::std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)(local_1328 + 0x10),&local_134c);
                  *pmVar22 = mVar1;
                  BVar25 = *(BuiltIn *)((long)(pDVar5->extended).values + lVar32 + -0x80);
                  local_1350 = (undefined4)CONCAT71((int7)((ulong)pmVar22 >> 8),1);
                  this = local_1360;
                }
                if (((BVar25 < BuiltInVertexId) && (BVar25 != 2)) &&
                   ((*(byte *)((long)&(pDVar5->decoration_flags).lower + lVar32 + 3) & 0x20) != 0))
                {
                  uVar16 = *(uint32_t *)((long)(pDVar5->extended).values + lVar32 + -0x60);
                  if ((bVar10) && (local_1378 != uVar16)) {
                    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error(prVar24,"IO block member Stream mismatch.");
                    *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
                    __cxa_throw(prVar24,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  bVar10 = true;
                  local_1378 = uVar16;
                }
              }
              uVar29 = (ulong)((int)uVar29 + 1);
              lVar32 = lVar32 + 0x188;
            } while (sVar3 * 0x188 - lVar32 != 0);
          }
          model = local_133c;
          storage = local_1354;
          pSVar11 = local_1368;
          if (local_1354 != Output) goto LAB_002c7eea;
          bVar12 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(local_1368->super_IVariant).self.id,
                              DecorationXfbBuffer);
          if ((bVar12) &&
             (bVar12 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id,
                                  DecorationXfbStride), bVar12)) {
            uVar16 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id,
                                DecorationXfbBuffer);
            uVar17 = Compiler::get_decoration
                               (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id,
                                DecorationXfbStride);
            if (bVar14) {
              if (uVar16 != local_1374) {
                prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error(prVar24,"IO block member XfbBuffer mismatch.");
LAB_002c88d0:
                *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
                __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if (uVar17 != local_1370) {
                prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                ::std::runtime_error::runtime_error(prVar24,"IO block member XfbBuffer mismatch.");
                goto LAB_002c88d0;
              }
            }
            bVar14 = true;
            this = local_1360;
            local_1374 = uVar16;
            local_1370 = uVar17;
          }
          bVar12 = Compiler::has_decoration
                             (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id,
                              DecorationStream);
          if (!bVar12) goto LAB_002c7eea;
          uVar16 = Compiler::get_decoration
                             (&this->super_Compiler,(ID)(pSVar11->super_IVariant).self.id,
                              DecorationStream);
          if ((bVar10) && (local_1378 != uVar16)) {
            prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar24,"IO block member Stream mismatch.");
            *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
            __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
LAB_002c7ee0:
          local_1378 = uVar16;
          bVar10 = true;
        }
        else {
LAB_002c7d62:
          if ((!bVar12 && SVar18 == storage) &&
             (bVar12 = Compiler::is_builtin_variable(&this->super_Compiler,local_1368), bVar12)) {
            local_1368 = (SPIRVariable *)&(local_1368->super_IVariant).self;
            pmVar21 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1330,(key_type *)local_1368);
            if (((pmVar21->decoration).builtin == true) &&
               ((BVar25 = (pmVar21->decoration).builtin_type, BVar25 < BuiltInVertexId &&
                (BVar25 != 2)))) {
              local_1280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((ulong)local_1280 | 1L << ((byte)BVar25 & 0x3f));
              if (BVar25 == BuiltInClipDistance) {
                uVar16 = to_array_size_literal(this,local_1348,0);
                psVar26 = (string *)local_1328;
LAB_002c7e0f:
                *(uint32_t *)(psVar26->_M_dataplus)._M_p = uVar16;
                BVar25 = (pmVar21->decoration).builtin_type;
              }
              else if (BVar25 == BuiltInCullDistance) {
                uVar16 = to_array_size_literal(this,local_1348,0);
                psVar26 = &local_12e0;
                goto LAB_002c7e0f;
              }
              if (((BVar25 < BuiltInVertexId) && (BVar25 != 2)) &&
                 ((~(pmVar21->decoration).decoration_flags.lower & 0x3800000000) == 0)) {
                uVar16 = (pmVar21->decoration).offset;
                local_134c = BVar25;
                pmVar22 = ::std::__detail::
                          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)(local_1328 + 0x10),&local_134c);
                *pmVar22 = uVar16;
                uVar16 = (pmVar21->decoration).xfb_buffer;
                uVar17 = (pmVar21->decoration).xfb_stride;
                if (bVar14 != false) {
                  if (uVar16 != local_1374) {
                    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (prVar24,"IO block member XfbBuffer mismatch.");
LAB_002c892a:
                    *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
                    __cxa_throw(prVar24,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  if (uVar17 != local_1370) {
                    prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                    ::std::runtime_error::runtime_error
                              (prVar24,"IO block member XfbBuffer mismatch.");
                    goto LAB_002c892a;
                  }
                }
                BVar25 = (pmVar21->decoration).builtin_type;
                local_1350 = (undefined4)CONCAT71((uint7)(uint3)(uVar16 >> 8),1);
                bVar14 = true;
                this = local_1360;
                local_1374 = uVar16;
                local_1370 = uVar17;
              }
              if (((BVar25 < BuiltInVertexId) && (BVar25 != 2)) &&
                 (((pmVar21->decoration).decoration_flags.lower & 0x20000000) != 0)) {
                uVar16 = Compiler::get_decoration
                                   (&this->super_Compiler,
                                    (ID)*(uint32_t *)&(local_1368->super_IVariant)._vptr_IVariant,
                                    DecorationStream);
                if ((bVar10) && (local_1378 != uVar16)) {
                  prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
                  ::std::runtime_error::runtime_error(prVar24,"IO block member Stream mismatch.");
                  *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
                  __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                goto LAB_002c7ee0;
              }
            }
          }
        }
LAB_002c7eea:
        if (lStack_1108 != 0 ||
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          if ((local_136c & 1) != 0) {
            prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar24,"Cannot use more than one builtin I/O block.");
            *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
            __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_12c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1128._0_8_;
          local_136c = (uint)CONCAT71(SUB87(local_1128._0_8_,1),1);
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_12b8,
                     (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(local_1128 + 8));
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)(local_1128 + 8));
        pTVar28 = (TypedID<(spirv_cross::Types)0> *)local_1328._8_8_;
      }
      pTVar30 = pTVar30 + 1;
    } while (pTVar30 != pTVar28);
    bVar15 = bVar14 & (byte)local_1350;
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_1240);
  local_1280 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)((uint)local_1280 & 0x1b);
  pcVar27 = (char *)ap_Stack_10f0;
  local_1118._M_allocated_capacity = 1;
  local_1118._8_8_ = 0;
  lStack_1108._0_1_ = '\0';
  lStack_1108._1_1_ = '\0';
  lStack_1108._2_1_ = '\0';
  lStack_1108._3_1_ = '\0';
  lStack_1108._4_1_ = '\0';
  lStack_1108._5_1_ = '\0';
  lStack_1108._6_1_ = '\0';
  lStack_1108._7_1_ = '\0';
  local_1100[0] = '\0';
  local_1100[1] = '\0';
  local_1100[2] = -0x80;
  local_1100[3] = '?';
  local_10f8[0] = '\0';
  local_10f8[1] = '\0';
  local_10f8[2] = '\0';
  local_10f8[3] = '\0';
  local_10f8[4] = '\0';
  local_10f8[5] = '\0';
  local_10f8[6] = '\0';
  local_10f8[7] = '\0';
  ap_Stack_10f0[0] = (__node_base_ptr)0x0;
  local_1128._0_8_ = local_1280;
  local_1128._8_8_ = pcVar27;
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_move_assign(&local_1278,
                   (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(local_1128 + 8));
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_1128 + 8));
  this_00 = local_1360;
  if ((local_136c & 1) == 0) {
    local_12c0 = local_1280;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&local_12b8,&local_1278);
  }
  if (local_12b8._M_element_count == 0 &&
      local_12c0 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) goto LAB_002c8762;
  if (storage == Output) {
    local_1240.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &local_1240.stack_storage;
    local_1240.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .buffer_size = 0;
    local_1240.buffer_capacity = 8;
    if (bVar15 != 0) {
      if ((this_00->options).es != false) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar24,"Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
        goto LAB_002c89c0;
      }
      uVar2 = (this_00->options).version;
      if (uVar2 - 0x8c < 300) {
        local_1128._0_8_ = &local_1118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_enhanced_layouts","");
        require_extension_internal(this_00,(string *)local_1128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
        if ((((this_00->options).es & 1U) == 0) && ((this_00->options).version < 0x1b8)) {
          local_1128._0_8_ = &local_1118;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1128,"GL_ARB_enhanced_layouts","");
          require_extension_internal(this_00,(string *)local_1128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1128._0_8_ != &local_1118) {
            operator_delete((void *)local_1128._0_8_);
          }
        }
      }
      else if (uVar2 < 0x8c) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar24,"Component decoration is not supported in targets below GLSL 1.40.");
        goto LAB_002c89c0;
      }
      pcVar27 = ", xfb_stride = ";
      join<char_const(&)[14],unsigned_int&,char_const(&)[16],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"xfb_buffer = ",(char (*) [14])&local_1374,
                 (uint *)", xfb_stride = ",(char (*) [16])&local_1370,(uint *)in_R9);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      this_00 = local_1360;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
        this_00 = local_1360;
      }
    }
    if (bVar10) {
      EVar19 = Compiler::get_execution_model(&this_00->super_Compiler);
      if (EVar19 != ExecutionModelGeometry) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar24,"Geometry streams can only be used in geometry shaders.");
LAB_002c89c0:
        *(undefined ***)prVar24 = &PTR__runtime_error_0048ff00;
        __cxa_throw(prVar24,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((this_00->options).es == true) {
        prVar24 = (runtime_error *)__cxa_allocate_exception(0x10);
        ::std::runtime_error::runtime_error
                  (prVar24,"Multiple geometry streams not supported in ESSL.");
        goto LAB_002c89c0;
      }
      if ((this_00->options).version < 400) {
        local_1128._0_8_ = &local_1118;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1128,"GL_ARB_transform_feedback3","");
        require_extension_internal(this_00,(string *)local_1128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1128._0_8_ != &local_1118) {
          operator_delete((void *)local_1128._0_8_);
        }
      }
      join<char_const(&)[10],unsigned_int&>
                ((string *)local_1128,(spirv_cross *)"stream = ",(char (*) [10])&local_1378,
                 (uint *)pcVar27);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&local_1240,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1128);
      this_00 = local_1360;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1128._0_8_ != &local_1118) {
        operator_delete((void *)local_1128._0_8_);
        this_00 = local_1360;
      }
    }
    if (model == ExecutionModelMeshEXT) {
      statement<char_const(&)[24]>(this_00,(char (*) [24])"out gl_MeshPerVertexEXT");
    }
    else if (local_1240.
             super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .buffer_size == 0) {
      statement<char_const(&)[17]>(this_00,(char (*) [17])0x39d6c4);
    }
    else {
      local_110 = local_f8;
      local_1118._M_allocated_capacity = 0;
      local_1128._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_1128._8_8_ = (__node_base_ptr *)0x0;
      local_108 = 0;
      local_100 = 8;
      local_1354 = storage;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1240.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size != 0) {
        pbVar33 = local_1240.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr + local_1240.
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .buffer_size;
        pbVar31 = local_1240.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .ptr;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,(pbVar31->_M_dataplus)._M_p,
                     pbVar31->_M_string_length);
          if (pbVar31 !=
              local_1240.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr + (local_1240.
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .buffer_size - 1)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          pbVar31 = pbVar31 + 1;
        } while (pbVar31 != pbVar33);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_(&local_12e0,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      this_00 = local_1360;
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[19]>
                (local_1360,(char (*) [8])"layout(",&local_12e0,(char (*) [19])") out gl_PerVertex")
      ;
      model = local_133c;
      storage = local_1354;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12e0._M_dataplus._M_p != &local_12e0.field_2) {
        operator_delete(local_12e0._M_dataplus._M_p);
      }
    }
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::~SmallVector(&local_1240);
  }
  else {
    pSVar23 = Compiler::get_entry_point(&this_00->super_Compiler);
    if (pSVar23->geometry_passthrough == true) {
      statement<char_const(&)[36]>(this_00,(char (*) [36])"layout(passthrough) in gl_PerVertex");
    }
    else {
      statement<char_const(&)[16]>(this_00,(char (*) [16])0x39d6e9);
    }
  }
  statement<char_const(&)[2]>(this_00,(char (*) [2])0x384c27);
  this_00->indent = this_00->indent + 1;
  if (((ulong)local_12c0 & 1) != 0) {
    if (*(__node_base_ptr *)local_1318._M_allocated_capacity != (__node_base_ptr)0x0) {
      p_Var6 = (*(__node_base_ptr *)local_1318._M_allocated_capacity)->_M_nxt;
      uVar2 = *(uint *)&p_Var6[1]._M_nxt;
      do {
        if (uVar2 == 0) {
          statement<char_const(&)[21],unsigned_int&,char_const(&)[20]>
                    (this_00,(char (*) [21])"layout(xfb_offset = ",
                     (uint *)((long)&p_Var6[1]._M_nxt + 4),(char (*) [20])") vec4 gl_Position;");
          goto LAB_002c8488;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while ((p_Var6 != (_Hash_node_base *)0x0) &&
              (uVar2 = *(uint *)&p_Var6[1]._M_nxt, (ulong)uVar2 % (ulong)local_1318._8_8_ == 0));
    }
    if ((this_00->super_Compiler).position_invariant == true) {
      statement<char_const(&)[28]>(this_00,(char (*) [28])"invariant vec4 gl_Position;");
    }
    else {
      statement<char_const(&)[18]>(this_00,(char (*) [18])0x39d710);
    }
  }
LAB_002c8488:
  if (((ulong)local_12c0 & 2) != 0) {
    p_Var7 = *(__node_base_ptr *)
              (local_1318._M_allocated_capacity + (ulong)(local_1318._8_8_ != 1) * 8);
    if (p_Var7 != (__node_base_ptr)0x0) {
      p_Var6 = p_Var7->_M_nxt;
      uVar2 = *(uint *)&p_Var6[1]._M_nxt;
      do {
        if (uVar2 == 1) {
          statement<char_const(&)[21],unsigned_int&,char_const(&)[22]>
                    (this_00,(char (*) [21])"layout(xfb_offset = ",
                     (uint *)((long)&p_Var6[1]._M_nxt + 4),(char (*) [22])") float gl_PointSize;");
          goto LAB_002c8504;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while ((p_Var6 != (_Hash_node_base *)0x0) &&
              (uVar2 = *(uint *)&p_Var6[1]._M_nxt,
              (uint)((ulong)uVar2 % (ulong)local_1318._8_8_) == (uint)(local_1318._8_8_ != 1)));
    }
    statement<char_const(&)[20]>(this_00,(char (*) [20])0x39d740);
  }
LAB_002c8504:
  if (((ulong)local_12c0 & 8) != 0) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_1318._8_8_;
    uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
    p_Var7 = *(__node_base_ptr *)(local_1318._M_allocated_capacity + (uVar29 & 0xffffffff) * 8);
    if (p_Var7 != (__node_base_ptr)0x0) {
      p_Var6 = p_Var7->_M_nxt;
      uVar2 = *(uint *)&p_Var6[1]._M_nxt;
      do {
        if (uVar2 == 3) {
          in_R9 = (char (*) [2])0x3822d7;
          statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                    (this_00,(char (*) [21])"layout(xfb_offset = ",
                     (uint *)((long)&p_Var6[1]._M_nxt + 4),(char (*) [25])") float gl_ClipDistance["
                     ,&local_1338,(char (*) [3])0x3822d7);
          goto LAB_002c85a2;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while ((p_Var6 != (_Hash_node_base *)0x0) &&
              (uVar2 = *(uint *)&p_Var6[1]._M_nxt, (ulong)uVar2 % (ulong)local_1318._8_8_ == uVar29)
              );
    }
    statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
              (this_00,(char (*) [23])0x39d756,&local_1338,(char (*) [3])0x3822d7);
  }
LAB_002c85a2:
  if (((ulong)local_12c0 & 0x10) != 0) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_1318._8_8_;
    uVar29 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar9,0);
    p_Var7 = *(__node_base_ptr *)(local_1318._M_allocated_capacity + (uVar29 & 0xffffffff) * 8);
    if (p_Var7 != (__node_base_ptr)0x0) {
      p_Var6 = p_Var7->_M_nxt;
      uVar2 = *(uint *)&p_Var6[1]._M_nxt;
      do {
        if (uVar2 == 4) {
          in_R9 = (char (*) [2])0x3822d7;
          statement<char_const(&)[21],unsigned_int&,char_const(&)[25],unsigned_int&,char_const(&)[3]>
                    (this_00,(char (*) [21])"layout(xfb_offset = ",
                     (uint *)((long)&p_Var6[1]._M_nxt + 4),(char (*) [25])") float gl_CullDistance["
                     ,&local_1334,(char (*) [3])0x3822d7);
          goto LAB_002c8640;
        }
        p_Var6 = p_Var6->_M_nxt;
      } while ((p_Var6 != (_Hash_node_base *)0x0) &&
              (uVar2 = *(uint *)&p_Var6[1]._M_nxt, (ulong)uVar2 % (ulong)local_1318._8_8_ == uVar29)
              );
    }
    statement<char_const(&)[23],unsigned_int&,char_const(&)[3]>
              (this_00,(char (*) [23])0x39d76f,&local_1334,(char (*) [3])0x3822d7);
  }
LAB_002c8640:
  if (model == ExecutionModelTessellationControl) {
    pcVar27 = "gl_out";
    if (storage == Input) {
      pcVar27 = "gl_in";
    }
    local_1240.
    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar27;
    if (storage == Output) {
      pSVar23 = Compiler::get_entry_point(&this_00->super_Compiler);
      join<char_const*&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                ((string *)local_1128,(spirv_cross *)&local_1240,(char **)0x3837e2,
                 (char (*) [2])&pSVar23->output_vertices,(uint *)0x3836e7,in_R9);
      end_scope_decl(this_00,(string *)local_1128);
    }
    else {
LAB_002c8711:
      join<char_const*&,char_const(&)[3]>
                ((string *)local_1128,(spirv_cross *)&local_1240,(char **)"[]",(char (*) [3])pcVar27
                );
      end_scope_decl(this_00,(string *)local_1128);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1128._0_8_ != &local_1118) {
      operator_delete((void *)local_1128._0_8_);
    }
  }
  else {
    if ((model == ExecutionModelMeshEXT && storage == Output) ||
       ((model & ~ExecutionModelTessellationControl) == ExecutionModelTessellationEvaluation &&
        storage == Input)) {
      pcVar27 = "gl_out";
      if (storage == Input) {
        pcVar27 = "gl_in";
      }
      local_1240.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             "gl_MeshVerticesEXT";
      if (model != ExecutionModelMeshEXT) {
        local_1240.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar27;
      }
      goto LAB_002c8711;
    }
    end_scope_decl(this_00);
  }
  statement<char_const(&)[1]>(this_00,(char (*) [1])0x34ea49);
LAB_002c8762:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_1328 + 0x10));
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_1278);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_12b8);
  return;
}

Assistant:

void CompilerGLSL::emit_declared_builtin_block(StorageClass storage, ExecutionModel model)
{
	Bitset emitted_builtins;
	Bitset global_builtins;
	const SPIRVariable *block_var = nullptr;
	bool emitted_block = false;

	// Need to use declared size in the type.
	// These variables might have been declared, but not statically used, so we haven't deduced their size yet.
	uint32_t cull_distance_size = 0;
	uint32_t clip_distance_size = 0;

	bool have_xfb_buffer_stride = false;
	bool have_geom_stream = false;
	bool have_any_xfb_offset = false;
	uint32_t xfb_stride = 0, xfb_buffer = 0, geom_stream = 0;
	std::unordered_map<uint32_t, uint32_t> builtin_xfb_offsets;

	const auto builtin_is_per_vertex_set = [](BuiltIn builtin) -> bool {
		return builtin == BuiltInPosition || builtin == BuiltInPointSize ||
			builtin == BuiltInClipDistance || builtin == BuiltInCullDistance;
	};

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		Bitset builtins;

		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t index = 0;
			for (auto &m : ir.meta[type.self].members)
			{
				if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
				{
					builtins.set(m.builtin_type);
					if (m.builtin_type == BuiltInCullDistance)
						cull_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));
					else if (m.builtin_type == BuiltInClipDistance)
						clip_distance_size = to_array_size_literal(this->get<SPIRType>(type.member_types[index]));

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationOffset))
					{
						have_any_xfb_offset = true;
						builtin_xfb_offsets[m.builtin_type] = m.offset;
					}

					if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
					{
						uint32_t stream = m.stream;
						if (have_geom_stream && geom_stream != stream)
							SPIRV_CROSS_THROW("IO block member Stream mismatch.");
						have_geom_stream = true;
						geom_stream = stream;
					}
				}
				index++;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationXfbBuffer) &&
			    has_decoration(var.self, DecorationXfbStride))
			{
				uint32_t buffer_index = get_decoration(var.self, DecorationXfbBuffer);
				uint32_t stride = get_decoration(var.self, DecorationXfbStride);
				if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				if (have_xfb_buffer_stride && stride != xfb_stride)
					SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
				have_xfb_buffer_stride = true;
				xfb_buffer = buffer_index;
				xfb_stride = stride;
			}

			if (storage == StorageClassOutput && has_decoration(var.self, DecorationStream))
			{
				uint32_t stream = get_decoration(var.self, DecorationStream);
				if (have_geom_stream && geom_stream != stream)
					SPIRV_CROSS_THROW("IO block member Stream mismatch.");
				have_geom_stream = true;
				geom_stream = stream;
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			// While we're at it, collect all declared global builtins (HLSL mostly ...).
			auto &m = ir.meta[var.self].decoration;
			if (m.builtin && builtin_is_per_vertex_set(m.builtin_type))
			{
				// For mesh/tesc output, Clip/Cull is an array-of-array. Look at innermost array type
				// for correct result.
				global_builtins.set(m.builtin_type);
				if (m.builtin_type == BuiltInCullDistance)
					cull_distance_size = to_array_size_literal(type, 0);
				else if (m.builtin_type == BuiltInClipDistance)
					clip_distance_size = to_array_size_literal(type, 0);

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationXfbStride) &&
				    m.decoration_flags.get(DecorationXfbBuffer) && m.decoration_flags.get(DecorationOffset))
				{
					have_any_xfb_offset = true;
					builtin_xfb_offsets[m.builtin_type] = m.offset;
					uint32_t buffer_index = m.xfb_buffer;
					uint32_t stride = m.xfb_stride;
					if (have_xfb_buffer_stride && buffer_index != xfb_buffer)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					if (have_xfb_buffer_stride && stride != xfb_stride)
						SPIRV_CROSS_THROW("IO block member XfbBuffer mismatch.");
					have_xfb_buffer_stride = true;
					xfb_buffer = buffer_index;
					xfb_stride = stride;
				}

				if (is_block_builtin(m.builtin_type) && m.decoration_flags.get(DecorationStream))
				{
					uint32_t stream = get_decoration(var.self, DecorationStream);
					if (have_geom_stream && geom_stream != stream)
						SPIRV_CROSS_THROW("IO block member Stream mismatch.");
					have_geom_stream = true;
					geom_stream = stream;
				}
			}
		}

		if (builtins.empty())
			return;

		if (emitted_block)
			SPIRV_CROSS_THROW("Cannot use more than one builtin I/O block.");

		emitted_builtins = builtins;
		emitted_block = true;
		block_var = &var;
	});

	global_builtins =
	    Bitset(global_builtins.get_lower() & ((1ull << BuiltInPosition) | (1ull << BuiltInPointSize) |
	                                          (1ull << BuiltInClipDistance) | (1ull << BuiltInCullDistance)));

	// Try to collect all other declared builtins.
	if (!emitted_block)
		emitted_builtins = global_builtins;

	// Can't declare an empty interface block.
	if (emitted_builtins.empty())
		return;

	if (storage == StorageClassOutput)
	{
		SmallVector<string> attr;
		if (have_xfb_buffer_stride && have_any_xfb_offset)
		{
			if (!options.es)
			{
				if (options.version < 440 && options.version >= 140)
					require_extension_internal("GL_ARB_enhanced_layouts");
				else if (options.version < 140)
					SPIRV_CROSS_THROW("Component decoration is not supported in targets below GLSL 1.40.");
				if (!options.es && options.version < 440)
					require_extension_internal("GL_ARB_enhanced_layouts");
			}
			else if (options.es)
				SPIRV_CROSS_THROW("Need GL_ARB_enhanced_layouts for xfb_stride or xfb_buffer.");
			attr.push_back(join("xfb_buffer = ", xfb_buffer, ", xfb_stride = ", xfb_stride));
		}

		if (have_geom_stream)
		{
			if (get_execution_model() != ExecutionModelGeometry)
				SPIRV_CROSS_THROW("Geometry streams can only be used in geometry shaders.");
			if (options.es)
				SPIRV_CROSS_THROW("Multiple geometry streams not supported in ESSL.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_transform_feedback3");
			attr.push_back(join("stream = ", geom_stream));
		}

		if (model == ExecutionModelMeshEXT)
			statement("out gl_MeshPerVertexEXT");
		else if (!attr.empty())
			statement("layout(", merge(attr), ") out gl_PerVertex");
		else
			statement("out gl_PerVertex");
	}
	else
	{
		// If we have passthrough, there is no way PerVertex cannot be passthrough.
		if (get_entry_point().geometry_passthrough)
			statement("layout(passthrough) in gl_PerVertex");
		else
			statement("in gl_PerVertex");
	}

	begin_scope();
	if (emitted_builtins.get(BuiltInPosition))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPosition);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") vec4 gl_Position;");
		else if (position_invariant)
			statement("invariant vec4 gl_Position;");
		else
			statement("vec4 gl_Position;");
	}

	if (emitted_builtins.get(BuiltInPointSize))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInPointSize);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_PointSize;");
		else
			statement("float gl_PointSize;");
	}

	if (emitted_builtins.get(BuiltInClipDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInClipDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_ClipDistance[", clip_distance_size, "];");
		else
			statement("float gl_ClipDistance[", clip_distance_size, "];");
	}

	if (emitted_builtins.get(BuiltInCullDistance))
	{
		auto itr = builtin_xfb_offsets.find(BuiltInCullDistance);
		if (itr != end(builtin_xfb_offsets))
			statement("layout(xfb_offset = ", itr->second, ") float gl_CullDistance[", cull_distance_size, "];");
		else
			statement("float gl_CullDistance[", cull_distance_size, "];");
	}

	bool builtin_array = model == ExecutionModelTessellationControl ||
	                     (model == ExecutionModelMeshEXT && storage == StorageClassOutput) ||
	                     (model == ExecutionModelGeometry && storage == StorageClassInput) ||
	                     (model == ExecutionModelTessellationEvaluation && storage == StorageClassInput);

	if (builtin_array)
	{
		const char *instance_name;
		if (model == ExecutionModelMeshEXT)
			instance_name = "gl_MeshVerticesEXT"; // Per primitive is never synthesized.
		else
			instance_name = storage == StorageClassInput ? "gl_in" : "gl_out";

		if (model == ExecutionModelTessellationControl && storage == StorageClassOutput)
			end_scope_decl(join(instance_name, "[", get_entry_point().output_vertices, "]"));
		else
			end_scope_decl(join(instance_name, "[]"));
	}
	else
		end_scope_decl();
	statement("");
}